

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::
IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>::iterate
          (TestStatus *__return_storage_ptr__,
          IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported> *this)

{
  deInt32 *pdVar1;
  int *piVar2;
  pointer pcVar3;
  vector<char,_std::allocator<char>_> *pvVar4;
  DrawType DVar5;
  VkPrimitiveTopology VVar6;
  Context *this_00;
  TestLog *pTVar7;
  pointer pcVar8;
  pointer pcVar9;
  pointer pcVar10;
  DeviceInterface *pDVar11;
  SharedPtrStateBase *pSVar12;
  Allocation *pAVar13;
  pointer __dest;
  Buffer *pBVar14;
  Image *this_01;
  void *pvVar15;
  VkQueue pVVar16;
  TestStatus *pTVar17;
  bool bVar18;
  VkResult VVar19;
  VkPrimitiveTopology *pVVar20;
  VkPrimitiveTopology *pVVar21;
  VkDevice pVVar22;
  Allocator *pAVar23;
  long lVar24;
  char *__s;
  TestError *this_02;
  deUint32 dVar25;
  uint uVar26;
  VkPrimitiveTopology VVar27;
  int y;
  size_t __n;
  int x;
  float fVar28;
  float fVar29;
  double dVar30;
  allocator<char> local_169;
  VkQueue local_168;
  undefined8 local_160;
  undefined4 local_158;
  IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported> *local_150;
  TestStatus *local_148;
  TestLog *local_140;
  double local_138;
  double local_130;
  VkSubmitInfo submitInfo;
  long *local_d8;
  long local_d0;
  long local_c8 [2];
  Texture2D referenceFrame;
  ConstPixelBufferAccess renderedFrame;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  
  this_00 = (this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.m_context;
  pTVar7 = this_00->m_testCtx->m_log;
  local_168 = Context::getUniversalQueue(this_00);
  DVar5 = (this->super_IndirectDraw).m_drawType;
  local_148 = __return_storage_ptr__;
  if (DVar5 == DRAW_TYPE_INDEXED) {
    VVar6 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_topology;
    VVar27 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN;
    if (VVar6 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      if (VVar6 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x255);
        goto LAB_006ec796;
      }
      VVar27 = VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY;
    }
    pvVar4 = &(this->super_IndirectDraw).m_indirectBufferContents;
    pcVar3 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar8 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (pvVar4,(size_type)(pcVar3 + (0x14 - (long)pcVar8)));
    pcVar9 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    *(VkPrimitiveTopology *)(pcVar3 + ((long)pcVar9 - (long)pcVar8)) = VVar6;
    pcVar3 = pcVar3 + (long)(pcVar9 + (4 - (long)pcVar8));
    pcVar3[0] = '\x04';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\x02';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar3[8] = '\r';
    pcVar3[9] = '\0';
    pcVar3[10] = '\0';
    pcVar3[0xb] = '\0';
    pcVar3[0xc] = '\0';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar8 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar9 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (pvVar4,(size_type)(pcVar8 + (0x14 - (long)pcVar9)));
    pcVar10 = (this->super_IndirectDraw).m_indirectBufferContents.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pcVar3 = pcVar8 + ((long)pcVar10 - (long)pcVar9);
    pcVar3[0] = -4;
    pcVar3[1] = -1;
    pcVar3[2] = -1;
    pcVar3[3] = -1;
    pcVar3[4] = -2;
    pcVar3[5] = -1;
    pcVar3[6] = -1;
    pcVar3[7] = -1;
    pcVar3[8] = -0xb;
    pcVar3[9] = -1;
    pcVar3[10] = -1;
    pcVar3[0xb] = -1;
    pcVar3[0xc] = '\t';
    pcVar3[0xd] = '\0';
    pcVar3[0xe] = '\0';
    pcVar3[0xf] = '\0';
    pcVar8 = pcVar8 + (long)(pcVar10 + (0x10 - (long)pcVar9));
    pcVar8[0] = -7;
    pcVar8[1] = -1;
    pcVar8[2] = -1;
    pcVar8[3] = -1;
    pcVar3 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar8 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (pvVar4,(size_type)(pcVar3 + (0x14 - (long)pcVar8)));
    pVVar20 = (VkPrimitiveTopology *)
              (pcVar3 + ((long)(this->super_IndirectDraw).m_indirectBufferContents.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start - (long)pcVar8));
    pVVar21 = pVVar20 + 4;
    *pVVar20 = VVar6;
    pVVar20[1] = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pVVar20[2] = VVar27;
    pVVar20[3] = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST_WITH_ADJACENCY|
                 VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN;
    dVar25 = 0x28;
LAB_006ebfcc:
    *pVVar21 = VK_PRIMITIVE_TOPOLOGY_POINT_LIST;
    (this->super_IndirectDraw).m_strideInBuffer = dVar25;
  }
  else if (DVar5 == DRAW_TYPE_SEQUENTIAL) {
    VVar6 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_topology;
    VVar27 = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_FAN;
    if (VVar6 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      if (VVar6 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x218);
        goto LAB_006ec796;
      }
      VVar27 = VK_PRIMITIVE_TOPOLOGY_LINE_LIST_WITH_ADJACENCY;
    }
    pvVar4 = &(this->super_IndirectDraw).m_indirectBufferContents;
    pcVar8 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar9 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (pvVar4,(size_type)(pcVar8 + (0x10 - (long)pcVar9)));
    pcVar10 = (this->super_IndirectDraw).m_indirectBufferContents.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
    *(VkPrimitiveTopology *)(pcVar8 + ((long)pcVar10 - (long)pcVar9)) = VVar6;
    pcVar3 = pcVar8 + (long)(pcVar10 + (4 - (long)pcVar9));
    pcVar3[0] = '\x04';
    pcVar3[1] = '\0';
    pcVar3[2] = '\0';
    pcVar3[3] = '\0';
    pcVar3[4] = '\x02';
    pcVar3[5] = '\0';
    pcVar3[6] = '\0';
    pcVar3[7] = '\0';
    pcVar8 = pcVar8 + (long)(pcVar10 + (0xc - (long)pcVar9));
    pcVar8[0] = '\0';
    pcVar8[1] = '\0';
    pcVar8[2] = '\0';
    pcVar8[3] = '\0';
    pcVar3 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar8 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (pvVar4,(size_type)(pcVar3 + (0x10 - (long)pcVar8)));
    pcVar3 = pcVar3 + ((long)(this->super_IndirectDraw).m_indirectBufferContents.
                             super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start - (long)pcVar8);
    pcVar3[0] = -4;
    pcVar3[1] = -1;
    pcVar3[2] = -1;
    pcVar3[3] = -1;
    pcVar3[4] = -2;
    pcVar3[5] = -1;
    pcVar3[6] = -1;
    pcVar3[7] = -1;
    pcVar3[8] = -0xb;
    pcVar3[9] = -1;
    pcVar3[10] = -1;
    pcVar3[0xb] = -1;
    pcVar3[0xc] = -9;
    pcVar3[0xd] = -1;
    pcVar3[0xe] = -1;
    pcVar3[0xf] = -1;
    pcVar3 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    pcVar8 = (this->super_IndirectDraw).m_indirectBufferContents.
             super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
             _M_start;
    std::vector<char,_std::allocator<char>_>::resize
              (pvVar4,(size_type)(pcVar3 + (0x10 - (long)pcVar8)));
    pVVar20 = (VkPrimitiveTopology *)
              (pcVar3 + ((long)(this->super_IndirectDraw).m_indirectBufferContents.
                               super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_start - (long)pcVar8));
    pVVar21 = pVVar20 + 3;
    *pVVar20 = VVar6;
    pVVar20[1] = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP;
    pVVar20[2] = VVar27;
    dVar25 = 0x20;
    goto LAB_006ebfcc;
  }
  (this->super_IndirectDraw).m_drawCount = 2;
  (this->super_IndirectDraw).m_offsetInBuffer = 8;
  local_140 = pTVar7;
  DrawTestsBaseClass::beginRenderPass((DrawTestsBaseClass *)this);
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar11->_vptr_DeviceInterface[0x58])
            (pDVar11,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                     super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0);
  __n = (long)(this->super_IndirectDraw).m_indirectBufferContents.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_finish -
        (long)(this->super_IndirectDraw).m_indirectBufferContents.
              super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
              _M_start;
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  pVVar22 = Context::getDevice((this->super_IndirectDraw).super_DrawTestsBaseClass.
                               super_TestInstance.m_context);
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)&referenceFrame,(this->super_IndirectDraw).m_offsetInBuffer + __n,
             0x100,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar23 = Context::getDefaultAllocator
                      ((this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  Draw::Buffer::createAndAlloc
            ((Buffer *)&submitInfo,pDVar11,pVVar22,(VkBufferCreateInfo *)&referenceFrame,pAVar23,
             (MemoryRequirement)0x1);
  pSVar12 = (this->super_IndirectDraw).m_indirectBuffer.m_state;
  if (pSVar12 == (SharedPtrStateBase *)submitInfo.pNext) {
LAB_006ec15e:
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      piVar2 = (int *)((long)submitInfo.pNext + 8);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
        submitInfo._4_4_ = 0;
        (**(code **)(*submitInfo.pNext + 0x10))();
      }
      LOCK();
      piVar2 = (int *)((long)submitInfo.pNext + 0xc);
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (*piVar2 == 0) {
        if (submitInfo.pNext != (void *)0x0) {
          (**(code **)(*submitInfo.pNext + 8))();
        }
        submitInfo.pNext = (void *)0x0;
      }
    }
  }
  else {
    if (pSVar12 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar1 = &pSVar12->strongRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        (this->super_IndirectDraw).m_indirectBuffer.m_ptr = (Buffer *)0x0;
        (*((this->super_IndirectDraw).m_indirectBuffer.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar1 = &((this->super_IndirectDraw).m_indirectBuffer.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + -1;
      UNLOCK();
      if (*pdVar1 == 0) {
        pSVar12 = (this->super_IndirectDraw).m_indirectBuffer.m_state;
        if (pSVar12 != (SharedPtrStateBase *)0x0) {
          (*pSVar12->_vptr_SharedPtrStateBase[1])();
        }
        (this->super_IndirectDraw).m_indirectBuffer.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->super_IndirectDraw).m_indirectBuffer.m_ptr = (Buffer *)submitInfo._0_8_;
    (this->super_IndirectDraw).m_indirectBuffer.m_state = (SharedPtrStateBase *)submitInfo.pNext;
    if (submitInfo.pNext != (void *)0x0) {
      LOCK();
      *(int *)((long)submitInfo.pNext + 8) = *(int *)((long)submitInfo.pNext + 8) + 1;
      UNLOCK();
      LOCK();
      pdVar1 = &((this->super_IndirectDraw).m_indirectBuffer.m_state)->weakRefCount;
      *pdVar1 = *pdVar1 + 1;
      UNLOCK();
      goto LAB_006ec15e;
    }
  }
  pvVar15 = (void *)CONCAT44(referenceFrame.m_height,referenceFrame.m_width);
  if (pvVar15 != (void *)0x0) {
    operator_delete(pvVar15,(long)referenceFrame.m_view.m_levels - (long)pvVar15);
  }
  pAVar13 = (((this->super_IndirectDraw).m_indirectBuffer.m_ptr)->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00d50278;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar13->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar13->m_offset;
  __dest = (pointer)pAVar13->m_hostPtr;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = __dest;
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  memcpy(__dest,&(this->super_IndirectDraw).m_junkData,(this->super_IndirectDraw).m_offsetInBuffer);
  memcpy((void *)((long)&__dest->m_ptr + (this->super_IndirectDraw).m_offsetInBuffer),
         (this->super_IndirectDraw).m_indirectBufferContents.
         super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start,
         __n);
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  pVVar22 = Context::getDevice((this->super_IndirectDraw).super_DrawTestsBaseClass.
                               super_TestInstance.m_context);
  pBVar14 = (this->super_IndirectDraw).m_indirectBuffer.m_ptr;
  pAVar13 = (pBVar14->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  referenceFrame.super_TextureLevelPyramid.m_format = (TextureFormat)&PTR__Allocation_00d50278;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(pAVar13->m_memory).m_internal;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)pAVar13->m_offset;
  referenceFrame.super_TextureLevelPyramid.m_data.
  super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)pAVar13->m_hostPtr;
  pAVar13 = (pBVar14->m_allocation).
            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr;
  submitInfo._0_8_ = &PTR__Allocation_00d50278;
  submitInfo.pNext = (void *)(pAVar13->m_memory).m_internal;
  submitInfo._16_8_ = pAVar13->m_offset;
  submitInfo.pWaitSemaphores = (VkSemaphore *)pAVar13->m_hostPtr;
  ::vk::flushMappedMemoryRange
            (pDVar11,pVVar22,
             (VkDeviceMemory)
             referenceFrame.super_TextureLevelPyramid.m_data.
             super__Vector_base<de::ArrayBuffer<unsigned_char,_1UL,_1UL>,_std::allocator<de::ArrayBuffer<unsigned_char,_1UL,_1UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start,submitInfo._16_8_,
             __n + (this->super_IndirectDraw).m_offsetInBuffer);
  ::vk::Allocation::~Allocation((Allocation *)&submitInfo);
  ::vk::Allocation::~Allocation((Allocation *)&referenceFrame);
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar11->_vptr_DeviceInterface[0x4c])
            (pDVar11,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                     super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,0,
             (this->super_IndirectDraw).super_DrawTestsBaseClass.m_pipeline.
             super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.object.m_internal);
  if ((this->super_IndirectDraw).m_drawType == DRAW_TYPE_INDEXED) {
    pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
    (*pDVar11->_vptr_DeviceInterface[0x57])
              (pDVar11,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                       super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->super_IndirectDraw).m_indexBuffer.m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,0,1);
  }
  uVar26 = (this->super_IndirectDraw).m_drawCount;
  if ((this->super_IndirectDraw).m_isMultiDrawEnabled == 0) {
    if (uVar26 == 0) goto LAB_006ec3d9;
  }
  else if (uVar26 <= (this->super_IndirectDraw).m_drawIndirectMaxCount) {
    DVar5 = (this->super_IndirectDraw).m_drawType;
    lVar24 = 0x2d8;
    if (DVar5 != DRAW_TYPE_SEQUENTIAL) {
      if (DVar5 != DRAW_TYPE_INDEXED) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x28c);
LAB_006ec796:
        __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      lVar24 = 0x2e0;
    }
    pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
    (**(code **)((long)pDVar11->_vptr_DeviceInterface + lVar24))
              (pDVar11,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                       super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->super_IndirectDraw).m_indirectBuffer.m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (this->super_IndirectDraw).m_offsetInBuffer,uVar26,
               (this->super_IndirectDraw).m_strideInBuffer);
    goto LAB_006ec3d9;
  }
  uVar26 = 0;
  do {
    DVar5 = (this->super_IndirectDraw).m_drawType;
    lVar24 = 0x2d8;
    if (DVar5 != DRAW_TYPE_SEQUENTIAL) {
      if (DVar5 != DRAW_TYPE_INDEXED) {
        this_02 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (this_02,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x29c);
        goto LAB_006ec796;
      }
      lVar24 = 0x2e0;
    }
    pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
    (**(code **)((long)pDVar11->_vptr_DeviceInterface + lVar24))
              (pDVar11,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                       super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object,
               (((this->super_IndirectDraw).m_indirectBuffer.m_ptr)->m_object).
               super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal,
               (ulong)((this->super_IndirectDraw).m_strideInBuffer * uVar26) +
               (this->super_IndirectDraw).m_offsetInBuffer,1,0);
    uVar26 = uVar26 + 1;
  } while (uVar26 < (this->super_IndirectDraw).m_drawCount);
LAB_006ec3d9:
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar11->_vptr_DeviceInterface[0x76])
            (pDVar11,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                     super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  (*pDVar11->_vptr_DeviceInterface[0x4a])
            (pDVar11,(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                     super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object);
  pVVar16 = local_168;
  submitInfo.pNext = (void *)0x0;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pSignalSemaphores = (VkSemaphore *)0x0;
  submitInfo.sType = VK_STRUCTURE_TYPE_SUBMIT_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.commandBufferCount = 1;
  submitInfo._44_4_ = 0;
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  submitInfo.pCommandBuffers =
       (VkCommandBuffer *)&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer;
  VVar19 = (*pDVar11->_vptr_DeviceInterface[2])(pDVar11,local_168,1);
  ::vk::checkResult(VVar19,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2af);
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  VVar19 = (*pDVar11->_vptr_DeviceInterface[3])(pDVar11,pVVar16);
  ::vk::checkResult(VVar19,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2b1);
  pDVar11 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  VVar19 = (*pDVar11->_vptr_DeviceInterface[3])(pDVar11,pVVar16);
  ::vk::checkResult(VVar19,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2b4);
  local_150 = this;
  renderedFrame.m_format =
       ::vk::mapVkFormat((this->super_IndirectDraw).super_DrawTestsBaseClass.m_colorAttachmentFormat
                        );
  tcu::Texture2D::Texture2D(&referenceFrame,&renderedFrame.m_format,0x100,0x100);
  tcu::Texture2D::allocLevel(&referenceFrame,0);
  renderedFrame.m_format.order = R;
  renderedFrame.m_format.type = SNORM_INT8;
  renderedFrame.m_size.m_data[0] = 0;
  renderedFrame.m_size.m_data[1] = 0x3f800000;
  tcu::clear(referenceFrame.super_TextureLevelPyramid.m_access.
             super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
             _M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame);
  if (0 < referenceFrame.m_height) {
    local_138 = (double)referenceFrame.m_height * 0.5;
    dVar30 = (double)referenceFrame.m_width * 0.5;
    y = 0;
    local_130 = dVar30;
    do {
      if (0 < referenceFrame.m_width) {
        fVar28 = (float)((double)y / local_138) + -1.0;
        x = 0;
        do {
          if (((-0.6 <= fVar28 && fVar28 <= 0.3) &&
              (fVar29 = (float)((double)x / dVar30) + -1.0, -0.3 <= fVar29)) && (fVar29 <= 0.6)) {
            renderedFrame.m_format.order = R;
            renderedFrame.m_format.type = SNORM_INT8;
            renderedFrame.m_size.m_data[0] = 0x3f800000;
            renderedFrame.m_size.m_data[1] = 0x3f800000;
            tcu::PixelBufferAccess::setPixel
                      (referenceFrame.super_TextureLevelPyramid.m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start,(Vec4 *)&renderedFrame,x,y,0);
            dVar30 = local_130;
          }
          x = x + 1;
        } while (referenceFrame.m_width != x);
      }
      y = y + 1;
    } while (y != referenceFrame.m_height);
  }
  this_01 = (local_150->super_IndirectDraw).super_DrawTestsBaseClass.m_colorTargetImage.m_ptr;
  pAVar23 = Context::getDefaultAllocator
                      ((local_150->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  local_158 = 0;
  local_160 = 0;
  Image::readSurface(&renderedFrame,this_01,local_168,pAVar23,VK_IMAGE_LAYOUT_GENERAL,
                     (VkOffset3D)(ZEXT412(0) << 0x40),0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  bVar18 = tcu::fuzzyCompare(local_140,"Result","Image comparison result",
                             &(referenceFrame.super_TextureLevelPyramid.m_access.
                               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                               ._M_impl.super__Vector_impl_data._M_start)->
                              super_ConstPixelBufferAccess,&renderedFrame,0.05,COMPARE_LOG_RESULT);
  __s = qpGetTestResultName((uint)!bVar18);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,__s,&local_169);
  pTVar17 = local_148;
  local_148->m_code = (uint)!bVar18;
  (local_148->m_description)._M_dataplus._M_p = (pointer)&(local_148->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_148->m_description,local_d8,local_d0 + (long)local_d8);
  if (local_d8 != local_c8) {
    operator_delete(local_d8,local_c8[0] + 1);
  }
  tcu::Texture3D::~Texture3D((Texture3D *)&referenceFrame);
  return pTVar17;
}

Assistant:

tcu::TestStatus IndirectDrawInstanced<FirstInstanceSupport>::iterate (void)
{
	tcu::TestLog &log = m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	if (m_drawType == DRAW_TYPE_SEQUENTIAL)
	{
		switch (m_topology)
		{
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			{
				vk::VkDrawIndirectCommand drawCmd[] =
				{
					{
						3,											//vertexCount
						4,											//instanceCount
						2,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
					{
						3,											//vertexCount
						4,											//instanceCount
						5,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			{
				vk::VkDrawIndirectCommand drawCmd[] =
				{
					{
						4,											//vertexCount
						4,											//instanceCount
						2,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 },
					{
						4,											//vertexCount
						4,											//instanceCount
						6,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			default:
				TCU_FAIL("impossible");
				break;
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndirectCommand);
	}
	else if (m_drawType == DRAW_TYPE_INDEXED)
	{
		switch (m_topology)
		{
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			{
				vk::VkDrawIndexedIndirectCommand drawCmd[] =
				{
					{
						3,											// indexCount
						4,											// instanceCount
						2,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 },	// junk (stride)
					{
						3,											// indexCount
						4,											// instanceCount
						5,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			{
				vk::VkDrawIndexedIndirectCommand drawCmd[] =
				{
					{
						4,											// indexCount
						4,											// instanceCount
						2,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 },	// junk (stride)
					{
						4,											// indexCount
						4,											// instanceCount
						6,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			default:
				TCU_FAIL("impossible");
				break;
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndexedIndirectCommand);
	}

	m_drawCount			= 2;
	m_offsetInBuffer	= sizeof(m_junkData);

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset = 0;
	const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	const vk::VkDeviceSize dataSize = m_indirectBufferContents.size();

	m_indirectBuffer = Buffer::createAndAlloc(	m_vk,
												m_context.getDevice(),
												BufferCreateInfo(dataSize + m_offsetInBuffer,
																 vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT),
												m_context.getDefaultAllocator(),
												vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indirectBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_junkData, static_cast<size_t>(m_offsetInBuffer));
	deMemcpy((ptr + m_offsetInBuffer), &m_indirectBufferContents[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   m_context.getDevice(),
							   m_indirectBuffer->getBoundMemory().getMemory(),
							   m_indirectBuffer->getBoundMemory().getOffset(),
							   dataSize + m_offsetInBuffer);

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	if (m_drawType == DRAW_TYPE_INDEXED)
	{
		m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), DE_NULL, vk::VK_INDEX_TYPE_UINT32);
	}

	if (m_isMultiDrawEnabled && m_drawCount <= m_drawIndirectMaxCount)
	{
		switch (m_drawType)
		{
			case DRAW_TYPE_SEQUENTIAL:
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			case DRAW_TYPE_INDEXED:
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			default:
				TCU_FAIL("impossible");
		}
	}
	else
	{
		for (deUint32 drawNdx = 0; drawNdx < m_drawCount; drawNdx++)
		{
			switch (m_drawType)
			{
				case DRAW_TYPE_SEQUENTIAL:
					m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				case DRAW_TYPE_INDEXED:
					m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				default:
					TCU_FAIL("impossible");
			}
		}
	}
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	VK_CHECK(m_vk.queueWaitIdle(queue));

	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));

	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageInstancedCoordinates refInstancedCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refInstancedCoords.bottom	&&
				 yCoord <= refInstancedCoords.top		&&
				 xCoord >= refInstancedCoords.left		&&
				 xCoord <= refInstancedCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

	}